

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_3dmUnitsAndTolerances::Read(ON_3dmUnitsAndTolerances *this,ON_BinaryArchive *file)

{
  OBSOLETE_DistanceDisplayMode OVar1;
  wchar_t *custom_unit_name_00;
  ON__UINT32 local_48 [2];
  uint dm;
  uint local_34;
  int i;
  ON_wString custom_unit_name;
  double meters_per_unit;
  LengthUnitSystem us;
  bool rc;
  ON_BinaryArchive *pOStack_18;
  int version;
  ON_BinaryArchive *file_local;
  ON_3dmUnitsAndTolerances *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Millimeters);
  meters_per_unit._4_4_ = 0;
  meters_per_unit._3_1_ =
       ON_BinaryArchive::ReadInt(pOStack_18,(ON__INT32 *)((long)&meters_per_unit + 4));
  if ((((bool)meters_per_unit._3_1_) && (99 < meters_per_unit._4_4_)) &&
     (meters_per_unit._4_4_ < 200)) {
    meters_per_unit._2_1_ = None;
    custom_unit_name.m_s = (wchar_t *)0x3ff0000000000000;
    ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffd0);
    local_34 = 0xffffffff;
    meters_per_unit._3_1_ = ON_BinaryArchive::ReadInt(pOStack_18,(ON__INT32 *)&local_34);
    if ((bool)meters_per_unit._3_1_) {
      meters_per_unit._2_1_ = ON::LengthUnitSystemFromUnsigned(local_34);
    }
    if ((meters_per_unit._3_1_ & 1) != 0) {
      meters_per_unit._3_1_ = ON_BinaryArchive::ReadDouble(pOStack_18,&this->m_absolute_tolerance);
    }
    if ((meters_per_unit._3_1_ & 1) != 0) {
      meters_per_unit._3_1_ = ON_BinaryArchive::ReadDouble(pOStack_18,&this->m_angle_tolerance);
    }
    if ((meters_per_unit._3_1_ & 1) != 0) {
      meters_per_unit._3_1_ = ON_BinaryArchive::ReadDouble(pOStack_18,&this->m_relative_tolerance);
    }
    if (100 < meters_per_unit._4_4_) {
      local_48[0] = 0;
      if ((meters_per_unit._3_1_ & 1) != 0) {
        meters_per_unit._3_1_ = ON_BinaryArchive::ReadInt(pOStack_18,local_48);
      }
      if ((meters_per_unit._3_1_ & 1) != 0) {
        OVar1 = ON::DistanceDisplayModeFromUnsigned(local_48[0]);
        this->m_distance_display_mode = OVar1;
      }
      if ((meters_per_unit._3_1_ & 1) != 0) {
        meters_per_unit._3_1_ =
             ON_BinaryArchive::ReadInt(pOStack_18,&this->m_distance_display_precision);
      }
      if ((this->m_distance_display_precision < 0) || (0x14 < this->m_distance_display_precision)) {
        this->m_distance_display_precision = 3;
      }
      if (0x65 < meters_per_unit._4_4_) {
        if ((meters_per_unit._3_1_ & 1) != 0) {
          meters_per_unit._3_1_ =
               ON_BinaryArchive::ReadDouble(pOStack_18,(double *)&custom_unit_name);
        }
        if ((meters_per_unit._3_1_ & 1) != 0) {
          meters_per_unit._3_1_ =
               ON_BinaryArchive::ReadString(pOStack_18,(ON_wString *)&stack0xffffffffffffffd0);
        }
      }
    }
    if (meters_per_unit._2_1_ == CustomUnits) {
      custom_unit_name_00 =
           ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffd0);
      ON_UnitSystem::SetCustomUnitSystem
                (&this->m_unit_system,custom_unit_name_00,(double)custom_unit_name.m_s);
    }
    else {
      ON_UnitSystem::SetUnitSystem(&this->m_unit_system,meters_per_unit._2_1_);
    }
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd0);
  }
  return (bool)(meters_per_unit._3_1_ & 1);
}

Assistant:

bool ON_3dmUnitsAndTolerances::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmUnitsAndTolerances::Millimeters;
  int version = 0;
  bool rc = file.ReadInt( &version );
  if ( rc && version >= 100 && version < 200 )
  {
    ON::LengthUnitSystem us = ON::LengthUnitSystem::None;
    double meters_per_unit = 1.0;
    ON_wString custom_unit_name;

    int i = ON_UNSET_UINT_INDEX;
    rc = file.ReadInt( &i );
    if ( rc )
      us = ON::LengthUnitSystemFromUnsigned(i);
    if ( rc ) rc = file.ReadDouble( &m_absolute_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_angle_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_relative_tolerance );
    if ( version >= 101 ) 
    {
      unsigned int dm = static_cast<unsigned int>(ON::OBSOLETE_DistanceDisplayMode::Decimal);
      if ( rc ) rc = file.ReadInt( &dm );
      if ( rc ) m_distance_display_mode = ON::DistanceDisplayModeFromUnsigned(dm);
      if ( rc ) rc = file.ReadInt( &m_distance_display_precision );
      if ( m_distance_display_precision < 0 || m_distance_display_precision > 20 )
        m_distance_display_precision = 3; // some beta files had bogus values stored in file
      if ( version >= 102 ) 
      {
        if ( rc ) rc = file.ReadDouble( &meters_per_unit );
        if ( rc ) rc = file.ReadString( custom_unit_name );
      }
    }
    if ( ON::LengthUnitSystem::CustomUnits == us )
      m_unit_system.SetCustomUnitSystem(custom_unit_name,meters_per_unit);
    else
      m_unit_system.SetUnitSystem(us);
  }
  return rc;
}